

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
xcardMT::LinearSearch_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,xcardMT *this)

{
  uint uVar1;
  char *__nptr;
  pointer pbVar2;
  undefined8 uVar3;
  size_type *psVar4;
  _Alloc_hider _Var5;
  int iVar6;
  int *piVar7;
  long lVar8;
  longlong lVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined1 *__s;
  int iVar12;
  ulong uVar13;
  undefined8 *puVar14;
  long lVar15;
  undefined1 auStack_108 [8];
  thread local_100;
  xcardMT *local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  long local_e0;
  undefined8 *local_d8;
  code *local_d0;
  undefined8 local_c8;
  size_type *local_c0;
  string max_search;
  size_type *local_88;
  string cardbuf;
  ulong local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *final_result;
  longlong card_b;
  undefined4 local_40;
  undefined4 local_3c;
  int *local_38;
  
  local_88 = &cardbuf._M_string_length;
  cardbuf._M_dataplus._M_p = (pointer)0x0;
  cardbuf._M_string_length._0_1_ = 0;
  __nptr = (this->super_xcard).prefix._M_dataplus._M_p;
  piVar7 = __errno_location();
  iVar12 = *piVar7;
  *piVar7 = 0;
  lVar8 = strtoll(__nptr,(char **)&local_c0,10);
  local_38 = piVar7;
  if (local_c0 == (size_type *)__nptr) {
    std::__throw_invalid_argument("stoll");
  }
  else {
    if (*piVar7 == 0) {
LAB_00105707:
      *piVar7 = iVar12;
    }
    else if (*piVar7 == 0x22) {
      lVar8 = std::__throw_out_of_range("stoll");
      goto LAB_00105707;
    }
    if (-1 < lVar8) {
      std::__cxx11::string::replace
                ((ulong)&local_88,0,(char *)0x0,(ulong)(this->super_xcard).prefix._M_dataplus._M_p);
    }
    _Var5._M_p = cardbuf._M_dataplus._M_p;
    local_c0 = &max_search._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_88,(long)local_88 + cardbuf._M_dataplus._M_p);
    if ((int)_Var5._M_p < 0x10) {
      iVar6 = 0x10 - (int)_Var5._M_p;
      iVar12 = 1;
      if (1 < iVar6) {
        iVar12 = iVar6;
      }
      do {
        std::__cxx11::string::replace
                  ((ulong)&local_c0,(ulong)max_search._M_dataplus._M_p,(char *)0x0,0x108175);
        std::__cxx11::string::replace
                  ((ulong)&local_88,(ulong)cardbuf._M_dataplus._M_p,(char *)0x0,0x108177);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    piVar7 = local_38;
    psVar4 = local_c0;
    card_b = CONCAT44(card_b._4_4_,*local_38);
    *local_38 = 0;
    lVar9 = strtoll((char *)local_c0,(char **)&local_d0,10);
    if (local_d0 != (code *)psVar4) {
      iVar12 = *piVar7;
      if (iVar12 == 0) {
LAB_00105804:
        *piVar7 = (int)card_b;
        iVar12 = (int)card_b;
      }
      else if (iVar12 == 0x22) {
        std::__throw_out_of_range("stoll");
        goto LAB_00105804;
      }
      psVar4 = local_88;
      *piVar7 = 0;
      final_result = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)strtoll((char *)local_88,(char **)&local_d0,10);
      if (local_d0 == (code *)psVar4) goto LAB_00105bbb;
      if (*piVar7 == 0) {
LAB_00105851:
        *piVar7 = iVar12;
      }
      else if (*piVar7 == 0x22) {
        final_result = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)std::__throw_out_of_range("stoll");
        goto LAB_00105851;
      }
      if (this->max_threads < 1) {
        uVar13 = std::thread::hardware_concurrency();
        this->max_threads = (int)uVar13;
        local_60 = uVar13 & 0xffffffff;
        max_search.field_2._8_8_ = auStack_108 + -(local_60 * 0x18 + 0xf & 0xfffffffffffffff0);
        if ((int)uVar13 == 0) {
          local_3c = (undefined4)CONCAT71((int7)(uVar13 >> 8),1);
          local_60 = 0;
          goto LAB_00105902;
        }
      }
      else {
        local_60 = (ulong)(uint)this->max_threads;
        max_search.field_2._8_8_ = auStack_108 + -(local_60 * 0x18 + 0xf & 0xfffffffffffffff0);
      }
      local_3c = 0;
      *(undefined8 *)(max_search.field_2._8_8_ + -8) = 0x105902;
      memset((void *)max_search.field_2._8_8_,0,((local_60 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
LAB_00105902:
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar8 = lVar9 - (long)final_result;
      local_d8 = (undefined8 *)(max_search.field_2._8_8_ + 8);
      cardbuf.field_2._8_8_ = max_search.field_2._8_8_;
      do {
        uVar1 = this->max_threads;
        card_b = lVar8 / (long)(int)uVar1;
        local_e0 = lVar8;
        if ((int)uVar1 < card_b) {
          uVar13 = (ulong)uVar1;
          uVar10 = uVar13 * 8 + 0xf & 0xfffffffffffffff0;
          __s = (undefined1 *)(max_search.field_2._8_8_ + -uVar10);
          if (uVar13 != 0) goto LAB_0010599f;
          local_40 = (undefined4)CONCAT71((int7)(uVar10 >> 8),1);
          uVar13 = 0;
          local_38 = (int *)__s;
        }
        else {
          this->max_threads = 1;
          __s = (undefined1 *)(max_search.field_2._8_8_ + -0x10);
          uVar13 = 1;
          card_b = lVar8;
LAB_0010599f:
          local_40 = 0;
          local_38 = (int *)__s;
          *(undefined8 *)(__s + -8) = 0x1059b9;
          memset(__s,0,uVar13 * 8);
        }
        iVar12 = this->max_threads;
        if ((long)final_result < lVar9 && 0 < iVar12) {
          lVar8 = 1;
          uVar11 = cardbuf.field_2._8_8_;
          do {
            local_d0 = runnerLS;
            local_c8 = 0;
            local_f8 = this;
            local_f0 = final_result;
            local_e8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)uVar11;
            final_result = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&(final_result->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + card_b);
            *(undefined8 *)(__s + -8) = 0x105a49;
            std::thread::
            thread<void(xcardMT::*)(long_long,long_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*),xcardMT*,long_long,long_long&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,void>
                      (&local_100,(offset_in_xcardMT_to_subr *)&local_d0,&local_f8,
                       (longlong *)&local_f0,(longlong *)&final_result,&local_e8);
            if (*(long *)((long)local_38 + lVar8 * 8 + -8) != 0) goto LAB_00105ca3;
            ((id *)((long)local_38 + lVar8 * 8 + -8))->_M_thread =
                 (native_handle_type)local_100._M_id._M_thread;
            iVar12 = this->max_threads;
            if (iVar12 <= lVar8) break;
            lVar8 = lVar8 + 1;
            uVar11 = uVar11 + 0x18;
          } while ((long)final_result < lVar9);
        }
        if (iVar12 < 1) {
          lVar8 = (long)iVar12;
        }
        else {
          lVar15 = 0;
          puVar14 = local_d8;
          do {
            *(undefined8 *)(__s + -8) = 0x105a9f;
            std::thread::join();
            pbVar2 = (__return_storage_ptr__->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            uVar11 = puVar14[-1];
            uVar3 = *puVar14;
            *(undefined8 *)(__s + -8) = 0x105ab5;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,pbVar2,uVar11,uVar3);
            lVar15 = lVar15 + 1;
            lVar8 = (long)this->max_threads;
            puVar14 = puVar14 + 3;
          } while (lVar15 < lVar8);
        }
        uVar11 = max_search.field_2._8_8_;
        if ((char)local_40 == '\0') {
          lVar15 = uVar13 << 3;
          do {
            if (*(long *)((long)local_38 + lVar15 + -8) != 0) {
LAB_00105ca3:
              *(code **)(__s + -8) =
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::push_back;
              std::terminate();
            }
            lVar15 = lVar15 + -8;
          } while (lVar15 != 0);
        }
        lVar8 = local_e0 - card_b * lVar8;
        if (lVar8 == 0) {
          if ((char)local_3c == '\0') {
            lVar15 = cardbuf.field_2._8_8_ + -0x18;
            lVar8 = local_60 * 0x18;
            do {
              *(undefined8 *)(uVar11 + -8) = 0x105b47;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(lVar15 + lVar8));
              lVar8 = lVar8 + -0x18;
            } while (lVar8 != 0);
          }
          if (local_c0 != &max_search._M_string_length) {
            operator_delete(local_c0);
          }
          if (local_88 != &cardbuf._M_string_length) {
            operator_delete(local_88);
          }
          return __return_storage_ptr__;
        }
      } while( true );
    }
  }
  std::__throw_invalid_argument("stoll");
LAB_00105bbb:
  uVar11 = std::__throw_invalid_argument("stoll");
  if (local_88 != &cardbuf._M_string_length) {
    operator_delete(local_88);
  }
  _Unwind_Resume(uVar11);
}

Assistant:

std::vector<std::string> xcardMT::LinearSearch()
{

    std::string cardbuf;

    if (std::stoll(this->prefix) > -1)
    {
        cardbuf.insert(0, this->prefix);
    }

    int initial_length = cardbuf.length();
    int zreq = 16 - initial_length;

    std::string max_search = cardbuf;

    for (int i = 0; i < zreq; i++)
    {
        max_search.insert(max_search.length(), "9");
        cardbuf.insert(cardbuf.length(), "0");
    }

    //convert to long long int
    long long int max_s = std::stoll(max_search);
    long long int card_b = std::stoll(cardbuf);

    //init. threads and results vector.
    if (this->max_threads <= 0){
        this->max_threads = std::thread::hardware_concurrency();
    }

    std::vector<std::string> results[this->max_threads];
    std::vector<std::string> final_result;

    long int remaining = max_s - card_b;

    while (true){
        long int per_thread = remaining / this->max_threads;

        if (per_thread <= this->max_threads){
            per_thread = remaining;
            this->max_threads = 1;
        }

        std::thread threads[this->max_threads];

        //dispatch
        for (int i = 0; i < this->max_threads && card_b < max_s; i++)
        {
            card_b += per_thread;
            threads[i] = std::thread(&xcardMT::runnerLS, this, card_b-per_thread, card_b, &results[i]);
        }
        

        //join
        for (int i = 0; i < this->max_threads; i++)
        {
            threads[i].join();
            final_result.insert(final_result.end(), results[i].begin(), results[i].end());
        }
        
        remaining -= per_thread * this->max_threads;
        if (remaining == 0){
            break;
        }

    }

    return final_result;
}